

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int DecodeImageStream(int xsize,int ysize,int is_level0,VP8LDecoder *dec,uint32_t **decoded_data)

{
  VP8LBitReader *br_00;
  uint32_t **decoded_data_00;
  ushort uVar1;
  ushort uVar2;
  HuffmanCode HVar3;
  uint32_t *puVar4;
  HuffmanCode *pHVar5;
  uint32_t uVar6;
  VP8LImageTransformType VVar7;
  uint32_t uVar8;
  int iVar9;
  void *__s;
  int *code_lengths;
  HuffmanCode *table;
  uint32_t *puVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  VP8LBitReader *br;
  int iVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  VP8LTransform *pVVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  HTreeGroup *local_98;
  uint32_t *local_80;
  int local_78;
  int local_74;
  HTreeGroup *local_70;
  HuffmanCode *local_68;
  uint local_5c;
  VP8LMetadata *local_58;
  uint32_t *local_50;
  void *local_48;
  ulong local_40;
  ulong local_38;
  
  br_00 = &dec->br_;
  local_58 = &dec->hdr_;
  if (is_level0 == 0) {
LAB_0010dbe8:
    bVar24 = true;
    uVar6 = VP8LReadBits(br_00,1);
    if (uVar6 == 0) goto LAB_0010dc23;
    uVar6 = VP8LReadBits(br_00,4);
    bVar24 = uVar6 - 1 < 0xb;
    if (bVar24) goto LAB_0010dc26;
LAB_0010e29a:
    uVar20 = (uint)bVar24;
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  }
  else {
    do {
      uVar6 = VP8LReadBits(br_00,1);
      if (uVar6 == 0) goto LAB_0010dbe8;
      iVar17 = dec->next_transform_;
      VVar7 = VP8LReadBits(br_00,2);
      bVar24 = true;
      if ((dec->transforms_seen_ >> (VVar7 & 0x1f) & 1) == 0) {
        pVVar21 = dec->transforms_ + iVar17;
        dec->transforms_seen_ = dec->transforms_seen_ | 1 << ((byte)VVar7 & 0x1f);
        pVVar21->type_ = VVar7;
        pVVar21->xsize_ = xsize;
        pVVar21->ysize_ = ysize;
        decoded_data_00 = &pVVar21->data_;
        pVVar21->data_ = (uint32_t *)0x0;
        dec->next_transform_ = dec->next_transform_ + 1;
        if (VVar7 < SUBTRACT_GREEN) {
          uVar6 = VP8LReadBits(br_00,3);
          bVar11 = (byte)(uVar6 + 2);
          pVVar21->bits_ = uVar6 + 2;
          iVar17 = (1 << (bVar11 & 0x1f)) + -1;
          iVar17 = DecodeImageStream((uint)(pVVar21->xsize_ + iVar17) >> (bVar11 & 0x1f),
                                     (uint)(iVar17 + pVVar21->ysize_) >> (bVar11 & 0x1f),0,dec,
                                     decoded_data_00);
          bVar24 = iVar17 == 0;
        }
        else if (VVar7 == COLOR_INDEXING_TRANSFORM) {
          uVar6 = VP8LReadBits(br_00,8);
          iVar17 = uVar6 + 1;
          uVar20 = 0;
          if ((iVar17 < 0x11) && (uVar20 = 1, iVar17 < 5)) {
            uVar20 = 2 < iVar17 ^ 3;
          }
          xsize = ((1 << (sbyte)uVar20) + pVVar21->xsize_) - 1U >> (sbyte)uVar20;
          pVVar21->bits_ = uVar20;
          iVar9 = DecodeImageStream(iVar17,1,0,dec,decoded_data_00);
          if (iVar9 != 0) {
            bVar11 = (byte)(8L >> ((byte)pVVar21->bits_ & 0x3f));
            puVar10 = (uint32_t *)WebPSafeMalloc(1L << (bVar11 & 0x3f),4);
            if (puVar10 != (uint32_t *)0x0) {
              puVar4 = *decoded_data_00;
              *puVar10 = *puVar4;
              uVar16 = 4;
              if (1 < iVar17) {
                uVar20 = iVar17 * 4;
                if (iVar17 * 4 < 6) {
                  uVar20 = 5;
                }
                uVar16 = 4;
                do {
                  *(char *)((long)puVar10 + uVar16) =
                       *(char *)((long)puVar10 + (uVar16 - 4)) + *(char *)((long)puVar4 + uVar16);
                  uVar16 = uVar16 + 1;
                } while (uVar20 != uVar16);
              }
              uVar20 = 4 << (bVar11 & 0x1f);
              if ((uint)uVar16 < uVar20) {
                memset((void *)((long)puVar10 + (uVar16 & 0xffffffff)),0,
                       (ulong)(uVar20 + ~(uint)uVar16) + 1);
              }
              WebPSafeFree(*decoded_data_00);
              *decoded_data_00 = puVar10;
              bVar24 = false;
            }
          }
        }
        else {
          bVar24 = false;
        }
      }
    } while (!bVar24);
    bVar24 = false;
LAB_0010dc23:
    uVar6 = 0;
LAB_0010dc26:
    bVar11 = (byte)uVar6;
    if (bVar24) {
      code_lengths = (int *)0x0;
      local_80 = (uint32_t *)0x0;
      uVar1 = kTableSize[(int)uVar6];
      if ((is_level0 == 0) || (uVar8 = VP8LReadBits(br_00,1), uVar8 == 0)) {
        uVar16 = 1;
        __s = (void *)0x0;
        uVar20 = 1;
LAB_0010ddfc:
        if ((dec->br_).eos_ == 0) {
          lVar15 = 0;
          uVar22 = 0;
          do {
            iVar17 = 0;
            if (lVar15 == 0) {
              iVar17 = 1 << (bVar11 & 0x1f);
            }
            if ((int)uVar6 < 1) {
              iVar17 = 0;
            }
            uVar23 = iVar17 + (uint)*(ushort *)((long)kAlphabetSize + lVar15);
            if ((int)uVar23 < (int)uVar22) {
              uVar23 = uVar22;
            }
            uVar22 = uVar23;
            lVar15 = lVar15 + 2;
          } while (lVar15 != 10);
          code_lengths = (int *)WebPSafeCalloc((ulong)uVar22,4);
          local_5c = uVar20;
          table = (HuffmanCode *)WebPSafeMalloc((ulong)uVar1 * (long)(int)uVar20,4);
          local_98 = VP8LHtreeGroupsNew(uVar20);
          if (((local_98 != (HTreeGroup *)0x0) && (code_lengths != (int *)0x0)) &&
             (table != (HuffmanCode *)0x0)) {
            iVar17 = 1 << (bVar11 & 0x1f);
            local_50 = &local_98->packed_table[0].value;
            uVar14 = 0;
            local_68 = table;
            local_48 = __s;
            local_40 = uVar16;
            do {
              local_38 = uVar14;
              if ((__s == (void *)0x0) ||
                 (uVar20 = *(uint *)((long)__s + uVar14 * 4), uVar14 = (ulong)uVar20,
                 uVar20 != 0xffffffff)) {
                lVar15 = (long)(int)uVar14;
                local_70 = local_98 + lVar15;
                uVar20 = 1;
                uVar16 = 0;
                local_78 = 0;
                local_74 = 0;
                do {
                  iVar9 = 0;
                  if (uVar16 == 0) {
                    iVar9 = iVar17;
                  }
                  uVar1 = kAlphabetSize[uVar16];
                  local_70->htrees[uVar16] = table;
                  if ((int)uVar6 < 1) {
                    iVar9 = 0;
                  }
                  uVar22 = iVar9 + (uint)uVar1;
                  iVar9 = ReadHuffmanCode(uVar22,dec,code_lengths,table);
                  if (iVar9 == 0) {
                    bVar24 = true;
                  }
                  else {
                    bVar24 = uVar20 != 0;
                    uVar20 = 0;
                    if (bVar24) {
                      if ((uVar16 & 3) == 0) {
                        uVar20 = 1;
                      }
                      else {
                        uVar20 = (uint)(table->bits == '\0');
                      }
                    }
                    local_74 = local_74 + (uint)table->bits;
                    table = table + iVar9;
                    bVar24 = false;
                    if (uVar16 != 4) {
                      iVar13 = *code_lengths;
                      if (1 < uVar22) {
                        uVar14 = 1;
                        do {
                          if (iVar13 < code_lengths[uVar14]) {
                            iVar13 = code_lengths[uVar14];
                          }
                          uVar14 = uVar14 + 1;
                        } while (uVar22 != uVar14);
                      }
                      local_78 = local_78 + iVar13;
                      bVar24 = false;
                    }
                  }
                  if (iVar9 == 0) goto LAB_0010e190;
                  uVar16 = uVar16 + 1;
                } while (uVar16 != 5);
                local_70->is_trivial_literal = uVar20;
                local_70->is_trivial_code = 0;
                if (uVar20 != 0) {
                  uVar20 = CONCAT22(local_70->htrees[1]->value,local_70->htrees[2]->value) |
                           (uint)local_70->htrees[3]->value << 0x18;
                  local_70->literal_arb = uVar20;
                  if ((local_74 == 0) && (uVar1 = local_70->htrees[0]->value, uVar1 < 0x100)) {
                    local_70->is_trivial_code = 1;
                    local_70->literal_arb = uVar20 | (uint)uVar1 << 8;
                  }
                }
                bVar25 = local_70->is_trivial_code == 0;
                local_70->use_packed_table = (uint)(local_78 < 6 && bVar25);
                bVar24 = false;
                if (local_78 < 6 && bVar25) {
                  pHVar5 = local_70->htrees[0];
                  lVar19 = 0;
                  do {
                    bVar12 = pHVar5[lVar19].bits;
                    uVar1 = pHVar5[lVar19].value;
                    if (uVar1 < 0x100) {
                      local_50[lVar15 * 0x8e + lVar19 * 2 + -1] = (uint)bVar12;
                      uVar20 = (uint)lVar19 >> (bVar12 & 0x1f);
                      local_50[lVar15 * 0x8e + lVar19 * 2] = (uint)uVar1 << 8;
                      HVar3 = local_70->htrees[1][uVar20];
                      uVar8 = ((uint)HVar3 & 0xff) + (uint)bVar12;
                      local_50[lVar15 * 0x8e + lVar19 * 2 + -1] = uVar8;
                      uVar23 = (uint)HVar3 & 0xffff0000 | (uint)uVar1 << 8;
                      local_50[lVar15 * 0x8e + lVar19 * 2] = uVar23;
                      uVar20 = uVar20 >> (HVar3.bits & 0x1f);
                      HVar3 = local_70->htrees[2][uVar20];
                      uVar8 = ((uint)HVar3 & 0xff) + uVar8;
                      local_50[lVar15 * 0x8e + lVar19 * 2 + -1] = uVar8;
                      uVar23 = (uint)HVar3 >> 0x10 | uVar23;
                      local_50[lVar15 * 0x8e + lVar19 * 2] = uVar23;
                      HVar3 = local_70->htrees[3][uVar20 >> (HVar3.bits & 0x1f)];
                      local_50[lVar15 * 0x8e + lVar19 * 2 + -1] = ((uint)HVar3 & 0xff) + uVar8;
                      local_50[lVar15 * 0x8e + lVar19 * 2] = ((uint)HVar3 & 0xff0000) << 8 | uVar23;
                    }
                    else {
                      local_50[lVar15 * 0x8e + lVar19 * 2 + -1] = bVar12 | 0x100;
                      local_50[lVar15 * 0x8e + lVar19 * 2] = (uint)uVar1;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x40);
                }
LAB_0010e190:
                __s = local_48;
                if (bVar24) {
                  if (!bVar24) goto LAB_0010e253;
LAB_0010e3d5:
                  uVar22 = 0;
                  bVar24 = true;
                  table = local_68;
                  goto LAB_0010e223;
                }
              }
              else {
                lVar15 = 0;
                do {
                  iVar9 = 0;
                  if (lVar15 == 0) {
                    iVar9 = iVar17;
                  }
                  if ((int)uVar6 < 1) {
                    iVar9 = 0;
                  }
                  iVar9 = ReadHuffmanCode(iVar9 + (uint)*(ushort *)((long)kAlphabetSize + lVar15),
                                          dec,code_lengths,(HuffmanCode *)0x0);
                  if (iVar9 == 0) goto LAB_0010e3d5;
                  lVar15 = lVar15 + 2;
                } while (lVar15 != 10);
              }
              uVar14 = local_38 + 1;
            } while (uVar14 != local_40);
            (dec->hdr_).huffman_image_ = local_80;
            (dec->hdr_).num_htree_groups_ = local_5c;
            (dec->hdr_).htree_groups_ = local_98;
            (dec->hdr_).huffman_tables_ = local_68;
            uVar22 = 1;
            bVar24 = false;
            table = local_68;
            goto LAB_0010e223;
          }
          dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
        }
        else {
          table = (HuffmanCode *)0x0;
          local_98 = (HTreeGroup *)0x0;
        }
        uVar22 = 0;
        bVar24 = true;
      }
      else {
        uVar8 = VP8LReadBits(br_00,3);
        bVar12 = (byte)(uVar8 + 2);
        iVar17 = 1 << (bVar12 & 0x1f);
        uVar16 = 1;
        uVar23 = (xsize + iVar17) - 1U >> (bVar12 & 0x1f);
        uVar20 = (ysize + iVar17) - 1U >> (bVar12 & 0x1f);
        uVar22 = 0;
        iVar17 = DecodeImageStream(uVar23,uVar20,0,dec,&local_80);
        if (iVar17 == 0) {
LAB_0010dde6:
          __s = (void *)0x0;
          uVar20 = 1;
          bVar24 = false;
        }
        else {
          uVar23 = uVar23 * uVar20;
          (dec->hdr_).huffman_subsample_bits_ = uVar8 + 2;
          if ((int)uVar23 < 1) {
            uVar16 = 1;
          }
          else {
            uVar16 = 1;
            uVar14 = 0;
            do {
              uVar2 = *(ushort *)((long)local_80 + uVar14 * 4 + 1);
              local_80[uVar14] = (uint)uVar2;
              if ((uint)uVar16 <= (uint)uVar2) {
                uVar16 = (ulong)(uVar2 + 1);
              }
              uVar14 = uVar14 + 1;
            } while (uVar23 != uVar14);
          }
          bVar24 = true;
          uVar20 = (uint)uVar16;
          if ((uVar20 < 0x3e9) && ((int)uVar20 <= xsize * ysize)) {
            __s = (void *)0x0;
          }
          else {
            local_70 = (HTreeGroup *)CONCAT44(local_70._4_4_,uVar23);
            __s = WebPSafeMalloc(uVar16,4);
            if (__s == (void *)0x0) {
              dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
              goto LAB_0010dde6;
            }
            memset(__s,0xff,uVar16 << 2);
            if ((int)local_70 < 1) {
              uVar20 = 0;
            }
            else {
              uVar14 = 0;
              uVar20 = 0;
              do {
                uVar18 = (ulong)local_80[uVar14];
                if (*(int *)((long)__s + uVar18 * 4) == -1) {
                  *(uint *)((long)__s + uVar18 * 4) = uVar20;
                  uVar20 = uVar20 + 1;
                }
                local_80[uVar14] = *(uint32_t *)((long)__s + uVar18 * 4);
                uVar14 = uVar14 + 1;
              } while (((ulong)local_70 & 0xffffffff) != uVar14);
            }
          }
        }
        if (bVar24) goto LAB_0010ddfc;
        bVar24 = true;
        code_lengths = (int *)0x0;
        table = (HuffmanCode *)0x0;
        local_98 = (HTreeGroup *)0x0;
      }
LAB_0010e223:
      WebPSafeFree(code_lengths);
      WebPSafeFree(__s);
      if (bVar24) {
        WebPSafeFree(local_80);
        WebPSafeFree(table);
        VP8LHtreeGroupsFree(local_98);
      }
LAB_0010e253:
      bVar24 = uVar22 != 0;
    }
    else {
      bVar24 = false;
    }
    uVar20 = (uint)bVar24;
    if (bVar24 == false) goto LAB_0010e29a;
    if ((int)uVar6 < 1) {
      local_58->color_cache_size_ = 0;
LAB_0010e2b7:
      iVar17 = (dec->hdr_).huffman_subsample_bits_;
      bVar11 = (byte)iVar17;
      dec->width_ = xsize;
      dec->height_ = ysize;
      (dec->hdr_).huffman_xsize_ = ((1 << (bVar11 & 0x1f)) + xsize) - 1U >> (bVar11 & 0x1f);
      (dec->hdr_).huffman_mask_ = -(uint)(iVar17 == 0) | ~(-1 << (bVar11 & 0x1f));
      if (is_level0 == 0) {
        puVar10 = (uint32_t *)WebPSafeMalloc((long)ysize * (long)xsize,4);
        if (puVar10 == (uint32_t *)0x0) {
          dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
          uVar20 = 0;
        }
        else {
          uVar20 = 0;
          iVar17 = DecodeImageData(dec,puVar10,xsize,ysize,ysize,(ProcessRowsFunc)0x0);
          if (iVar17 != 0) {
            uVar20 = (uint)((dec->br_).eos_ == 0);
          }
        }
        goto LAB_0010e311;
      }
      dec->state_ = READ_HDR;
    }
    else {
      (dec->hdr_).color_cache_size_ = 1 << (bVar11 & 0x1f);
      iVar17 = VP8LColorCacheInit(&(dec->hdr_).color_cache_,uVar6);
      if (iVar17 != 0) goto LAB_0010e2b7;
      dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      uVar20 = 0;
    }
  }
  puVar10 = (uint32_t *)0x0;
LAB_0010e311:
  if (uVar20 == 0) {
    WebPSafeFree(puVar10);
  }
  else {
    if (decoded_data != (uint32_t **)0x0) {
      *decoded_data = puVar10;
    }
    dec->last_pixel_ = 0;
    if (is_level0 != 0) {
      return uVar20;
    }
  }
  ClearMetadata(local_58);
  return uVar20;
}

Assistant:

static int DecodeImageStream(int xsize, int ysize,
                             int is_level0,
                             VP8LDecoder* const dec,
                             uint32_t** const decoded_data) {
  int ok = 1;
  int transform_xsize = xsize;
  int transform_ysize = ysize;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* data = NULL;
  int color_cache_bits = 0;

  // Read the transforms (may recurse).
  if (is_level0) {
    while (ok && VP8LReadBits(br, 1)) {
      ok = ReadTransform(&transform_xsize, &transform_ysize, dec);
    }
  }

  // Color cache
  if (ok && VP8LReadBits(br, 1)) {
    color_cache_bits = VP8LReadBits(br, 4);
    ok = (color_cache_bits >= 1 && color_cache_bits <= MAX_CACHE_BITS);
    if (!ok) {
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      goto End;
    }
  }

  // Read the Huffman codes (may recurse).
  ok = ok && ReadHuffmanCodes(dec, transform_xsize, transform_ysize,
                              color_cache_bits, is_level0);
  if (!ok) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    goto End;
  }

  // Finish setting up the color-cache
  if (color_cache_bits > 0) {
    hdr->color_cache_size_ = 1 << color_cache_bits;
    if (!VP8LColorCacheInit(&hdr->color_cache_, color_cache_bits)) {
      dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      ok = 0;
      goto End;
    }
  } else {
    hdr->color_cache_size_ = 0;
  }
  UpdateDecoder(dec, transform_xsize, transform_ysize);

  if (is_level0) {   // level 0 complete
    dec->state_ = READ_HDR;
    goto End;
  }

  {
    const uint64_t total_size = (uint64_t)transform_xsize * transform_ysize;
    data = (uint32_t*)WebPSafeMalloc(total_size, sizeof(*data));
    if (data == NULL) {
      dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      ok = 0;
      goto End;
    }
  }

  // Use the Huffman trees to decode the LZ77 encoded data.
  ok = DecodeImageData(dec, data, transform_xsize, transform_ysize,
                       transform_ysize, NULL);
  ok = ok && !br->eos_;

 End:
  if (!ok) {
    WebPSafeFree(data);
    ClearMetadata(hdr);
  } else {
    if (decoded_data != NULL) {
      *decoded_data = data;
    } else {
      // We allocate image data in this function only for transforms. At level 0
      // (that is: not the transforms), we shouldn't have allocated anything.
      assert(data == NULL);
      assert(is_level0);
    }
    dec->last_pixel_ = 0;  // Reset for future DECODE_DATA_FUNC() calls.
    if (!is_level0) ClearMetadata(hdr);  // Clean up temporary data behind.
  }
  return ok;
}